

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_info.hpp
# Opt level: O3

void __thiscall duckdb::RenameColumnInfo::RenameColumnInfo(RenameColumnInfo *this)

{
  *(undefined2 *)&(this->super_AlterTableInfo).super_AlterInfo.super_ParseInfo.info_type = 0x100;
  (this->super_AlterTableInfo).super_AlterInfo.catalog._M_dataplus._M_p =
       (pointer)&(this->super_AlterTableInfo).super_AlterInfo.catalog.field_2;
  (this->super_AlterTableInfo).super_AlterInfo.catalog._M_string_length = 0;
  (this->super_AlterTableInfo).super_AlterInfo.catalog.field_2._M_local_buf[0] = '\0';
  (this->super_AlterTableInfo).super_AlterInfo.schema._M_dataplus._M_p =
       (pointer)&(this->super_AlterTableInfo).super_AlterInfo.schema.field_2;
  (this->super_AlterTableInfo).super_AlterInfo.schema._M_string_length = 0;
  (this->super_AlterTableInfo).super_AlterInfo.schema.field_2._M_local_buf[0] = '\0';
  (this->super_AlterTableInfo).super_AlterInfo.name._M_dataplus._M_p =
       (pointer)&(this->super_AlterTableInfo).super_AlterInfo.name.field_2;
  (this->super_AlterTableInfo).super_AlterInfo.name._M_string_length = 0;
  (this->super_AlterTableInfo).super_AlterInfo.name.field_2._M_local_buf[0] = '\0';
  (this->super_AlterTableInfo).super_AlterInfo.field_0x71 = 1;
  (this->super_AlterTableInfo).super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__RenameColumnInfo_01980c10;
  (this->old_name)._M_dataplus._M_p = (pointer)&(this->old_name).field_2;
  (this->old_name)._M_string_length = 0;
  (this->old_name).field_2._M_local_buf[0] = '\0';
  (this->new_name)._M_dataplus._M_p = (pointer)&(this->new_name).field_2;
  (this->new_name)._M_string_length = 0;
  (this->new_name).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

explicit ParseInfo(ParseInfoType info_type) : info_type(info_type) {
	}